

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<short> *a)

{
  size_t count_00;
  short *p;
  bool local_1d;
  ON__INT32 local_1c;
  bool rc;
  ON_SimpleArray<short> *pOStack_18;
  int count;
  ON_SimpleArray<short> *a_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = a;
  a_local = (ON_SimpleArray<short> *)this;
  ON_SimpleArray<short>::Empty(a);
  local_1c = 0;
  local_1d = ReadInt(this,&local_1c);
  if ((local_1d) && (0 < local_1c)) {
    ON_SimpleArray<short>::SetCapacity(pOStack_18,(long)local_1c);
    count_00 = (size_t)local_1c;
    p = ON_SimpleArray<short>::Array(pOStack_18);
    local_1d = ReadShort(this,count_00,p);
    if (local_1d) {
      ON_SimpleArray<short>::SetCount(pOStack_18,local_1c);
    }
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON__INT16>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) {
    a.SetCapacity( count );
    rc = ReadShort( count, a.Array() );
    if ( rc )
      a.SetCount(count);
  }
  return rc;
}